

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcommon.c
# Opt level: O2

void parse_arguments(arguments *args,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  size_t sStack_40;
  
  args->filename = (char *)0x0;
  args->code = (char *)0x0;
  *(undefined8 *)&args->field_0x10 = 0;
  *(undefined2 *)&args->field_0x10 = 0x3f;
  args->mainfunc = "setup";
  uVar3 = 1;
  do {
    if (argc <= (int)uVar3) {
      if ((args->filename != (char *)0x0) && (args->code == (char *)0x0)) {
        pcVar2 = read_file(args->filename);
        args->code = pcVar2;
      }
      return;
    }
    pcVar2 = argv[(int)uVar3];
    iVar1 = strcmp(pcVar2,"--notypecheck");
    if (iVar1 == 0) {
      args->field_0x10 = args->field_0x10 & 0xfe;
    }
    else {
      iVar1 = strcmp(pcVar2,"--nolinearize");
      if (iVar1 == 0) {
        args->field_0x10 = args->field_0x10 & 0xfd;
      }
      else {
        iVar1 = strcmp(pcVar2,"--noastdump");
        if (iVar1 == 0) {
          args->field_0x10 = args->field_0x10 & 0xfb;
        }
        else {
          iVar1 = strcmp(pcVar2,"--noirdump");
          if (iVar1 == 0) {
            args->field_0x10 = args->field_0x10 & 0xf7;
          }
          else {
            iVar1 = strcmp(pcVar2,"--nocodump");
            if (iVar1 == 0) {
              args->field_0x10 = args->field_0x10 & 0xdf;
            }
            else {
              iVar1 = strcmp(pcVar2,"--nocfgdump");
              if (iVar1 == 0) {
                args->field_0x10 = args->field_0x10 & 0xef;
              }
              else {
                iVar1 = strcmp(pcVar2,"--simplify-ast");
                if (iVar1 == 0) {
                  args->field_0x10 = args->field_0x10 | 0x40;
                }
                else {
                  iVar1 = strcmp(pcVar2,"--remove-unreachable-blocks");
                  if (iVar1 == 0) {
                    args->field_0x10 = args->field_0x10 | 0x80;
                  }
                  else {
                    iVar1 = strcmp(pcVar2,"--gen-C");
                    if (iVar1 == 0) {
                      args->field_0x11 = args->field_0x11 | 1;
                    }
                    else {
                      iVar1 = strcmp(pcVar2,"--opt-upvalues");
                      if (iVar1 == 0) {
                        args->field_0x11 = args->field_0x11 | 2;
                      }
                      else {
                        iVar1 = strcmp(pcVar2,"--table-ast");
                        if (iVar1 == 0) {
                          args->field_0x11 = args->field_0x11 | 4;
                        }
                        else {
                          iVar1 = strcmp(pcVar2,"-main");
                          if (iVar1 == 0) {
                            if (argc + -1 <= (int)uVar3) {
                              pcVar2 = "Missing argument after -main\n";
                              sStack_40 = 0x1d;
LAB_00105c19:
                              fwrite(pcVar2,sStack_40,1,_stderr);
LAB_00105c22:
                              exit(1);
                            }
                            pcVar2 = strdup(argv[(long)(int)uVar3 + 1]);
                            args->mainfunc = pcVar2;
                            uVar3 = uVar3 + 1;
                          }
                          else if (((*pcVar2 == '-') && (pcVar2[1] == 'f')) && (pcVar2[2] == '\0'))
                          {
                            if (args->filename == (char *)0x0) {
                              if (argc + -1 <= (int)uVar3) {
                                pcVar2 = "Missing file name after -f\n";
                                sStack_40 = 0x1b;
                                goto LAB_00105c19;
                              }
                              pcVar2 = strdup(argv[(long)(int)uVar3 + 1]);
                              args->filename = pcVar2;
                              uVar3 = uVar3 + 1;
                            }
                            else {
                              fwrite("-f already accepted\n",0x14,1,_stderr);
                            }
                          }
                          else {
                            if (args->code != (char *)0x0) {
                              fprintf(_stderr,"Bad argument at %d",(ulong)uVar3);
                              goto LAB_00105c22;
                            }
                            pcVar2 = strdup(pcVar2);
                            args->code = pcVar2;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void parse_arguments(struct arguments *args, int argc, const char *argv[])
{
	memset(args, 0, sizeof *args);
	args->typecheck = 1;
	args->linearize = 1;
	args->astdump = 1;
	args->irdump = 1;
	args->cfgdump = 1;
	args->codump = 1;
	args->table_ast = 0;
	args->simplify_ast = 0;
	args->remove_unreachable_blocks = 0;
	args->gen_C = 0;
	args->opt_upvalue = 0;
	args->mainfunc = "setup";
	for (int i = 1; i < argc; i++) {
		if (strcmp(argv[i], "--notypecheck") == 0) {
			args->typecheck = 0;
		} else if (strcmp(argv[i], "--nolinearize") == 0) {
			args->linearize = 0;
		} else if (strcmp(argv[i], "--noastdump") == 0) {
			args->astdump = 0;
		} else if (strcmp(argv[i], "--noirdump") == 0) {
			args->irdump = 0;
		} else if (strcmp(argv[i], "--nocodump") == 0) {
			args->codump = 0;
		} else if (strcmp(argv[i], "--nocfgdump") == 0) {
			args->cfgdump = 0;
		} else if (strcmp(argv[i], "--simplify-ast") == 0) {
			args->simplify_ast = 1;
		} else if (strcmp(argv[i], "--remove-unreachable-blocks") == 0) {
			args->remove_unreachable_blocks = 1;
		} else if (strcmp(argv[i], "--gen-C") == 0) {
			args->gen_C = 1;
		} else if (strcmp(argv[i], "--opt-upvalues") == 0) {
			args->opt_upvalue = 1;
		} else if (strcmp(argv[i], "--table-ast") == 0) {
			args->table_ast = 1;
		} else if (strcmp(argv[i], "-main") == 0) {
			if (i < argc - 1) {
				i++;
				args->mainfunc = strdup(argv[i]);
			} else {
				fprintf(stderr, "Missing argument after -main\n");
				exit(1);
			}
		} else if (strcmp(argv[i], "-f") == 0) {
			if (args->filename) {
				fprintf(stderr, "-f already accepted\n");
				continue;
			}
			if (i < argc - 1) {
				i++;
				args->filename = strdup(argv[i]);
			} else {
				fprintf(stderr, "Missing file name after -f\n");
				exit(1);
			}
		} else {
			if (args->code) {
				fprintf(stderr, "Bad argument at %d", i);
				exit(1);
			} else {
				args->code = strdup(argv[i]);
			}
		}
	}
	if (args->filename && !args->code) {
		args->code = read_file(args->filename);
	}
}